

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_variantSetStmt
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                   *vslist,uint32_t indent)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  string *psVar4;
  bool bVar5;
  uint indent_00;
  ostream *poVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  uint32_t uVar10;
  size_type *psVar11;
  _Base_ptr p_Var12;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar13;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long lVar14;
  _Rb_tree_node_base *p_Var15;
  undefined1 in_R8B;
  const_iterator __begin4;
  _Base_ptr p_Var16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  stringstream ss;
  undefined1 local_278 [12];
  undefined4 uStack_26c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 *local_258;
  undefined8 local_250;
  uint local_244;
  string local_240;
  string local_220;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string *local_1e0;
  ulong local_1d8;
  _Rb_tree_header *local_1d0;
  _Rb_tree_node_base *local_1c8;
  _Base_ptr *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar17 = (ulong)indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  p_Var1 = (vslist->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  auVar19._8_8_ = extraout_RDX;
  auVar19._0_8_ = p_Var1;
  local_1d0 = &(vslist->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != local_1d0) {
    local_244 = indent + 1;
    indent_00 = indent + 2;
    local_1d8 = uVar17;
    do {
      p_Var15 = auVar19._0_8_;
      if (p_Var15[4]._M_parent != (_Base_ptr)0x0) {
        pprint::Indent_abi_cxx11_(&local_220,(pprint *)(uVar17 & 0xffffffff),auVar19._8_4_);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"variantSet ",0xb);
        local_200 = local_1f0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
        local_278._0_8_ = &local_268;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,local_200,local_1f8 + (long)local_200);
        ::std::__cxx11::string::_M_append((char *)local_278,*(ulong *)(p_Var15 + 1));
        plVar7 = (long *)::std::__cxx11::string::_M_append((char *)local_278,(ulong)local_200);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240.field_2._8_8_ = plVar7[3];
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_240._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ != &local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
        }
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_240._M_dataplus._M_p,local_240._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," = {\n",5);
        uVar13 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          uVar13 = extraout_RDX_01;
        }
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
          uVar13 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          uVar13 = extraout_RDX_03;
        }
        uVar10 = (uint32_t)uVar13;
        auVar18._8_8_ = uVar13;
        auVar18._0_8_ = p_Var15[3]._M_right;
        local_1c0 = &p_Var15[3]._M_parent;
        local_1c8 = p_Var15;
        if (p_Var15[3]._M_right != (_Base_ptr)local_1c0) {
          do {
            p_Var15 = auVar18._0_8_;
            pprint::Indent_abi_cxx11_(&local_220,(pprint *)(ulong)local_244,auVar18._8_4_);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            local_200 = local_1f0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"\"","");
            local_278._0_8_ = &local_268;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,local_200,local_1f8 + (long)local_200);
            ::std::__cxx11::string::_M_append((char *)local_278,*(ulong *)(p_Var15 + 1));
            plVar7 = (long *)::std::__cxx11::string::_M_append((char *)local_278,(ulong)local_200);
            local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
            psVar11 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_240.field_2._M_allocated_capacity = *psVar11;
              local_240.field_2._8_8_ = plVar7[3];
            }
            else {
              local_240.field_2._M_allocated_capacity = *psVar11;
              local_240._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_240._M_string_length = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._0_8_ != &local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
            }
            uVar10 = (uint32_t)psVar11;
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_240._M_dataplus._M_p,local_240._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_200 != local_1f0) {
              operator_delete(local_200,local_1f0[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            bVar5 = PrimMetas::authored((PrimMetas *)&p_Var15[3]._M_left);
            if (bVar5) {
              ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
              print_prim_metas_abi_cxx11_
                        ((string *)local_278,(tinyusdz *)&p_Var15[3]._M_left,
                         (PrimMeta *)(ulong)indent_00,uVar10);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
              uVar10 = extraout_EDX;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ != &local_268) {
                operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1)
                               );
                uVar10 = extraout_EDX_00;
              }
              pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(ulong)local_244,uVar10);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,(char *)local_278._0_8_,
                                  CONCAT44(uStack_26c,local_278._8_4_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ != &local_268) {
                operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1)
                               );
              }
            }
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
            print_props((string *)local_278,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)(p_Var15 + 2),indent_00);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._0_8_ != &local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
            }
            p_Var8 = p_Var15[0x1e]._M_left;
            p_Var12 = p_Var15[0x1e]._M_right;
            lVar14 = (long)p_Var12 - (long)p_Var8 >> 5;
            p_Var2 = p_Var15[0x23]._M_left;
            p_Var16 = p_Var15[0x23]._M_parent;
            if (lVar14 == ((long)p_Var2 - (long)p_Var16 >> 4) * 0x21cfb2b78c13521d) {
              local_278._8_4_ = 0;
              local_268._M_allocated_capacity = 0;
              local_268._8_8_ = local_278 + 8;
              local_250 = 0;
              local_258 = (undefined1 *)local_268._8_8_;
              if (p_Var2 != p_Var16) {
                lVar14 = 0;
                uVar17 = 0;
                do {
                  local_220._M_dataplus._M_p = (pointer)((long)&p_Var16->_M_color + lVar14);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                              *)local_278,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&p_Var16[0xd]._M_color + lVar14),(Prim **)&local_220);
                  uVar17 = uVar17 + 1;
                  p_Var16 = p_Var15[0x23]._M_parent;
                  lVar14 = lVar14 + 0x350;
                } while (uVar17 < (ulong)(((long)p_Var15[0x23]._M_left - (long)p_Var16 >> 4) *
                                         0x21cfb2b78c13521d));
                p_Var8 = p_Var15[0x1e]._M_left;
                p_Var12 = p_Var15[0x1e]._M_right;
              }
              if (p_Var12 != p_Var8) {
                lVar14 = 8;
                uVar17 = 0;
                do {
                  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                  lVar3 = *(long *)((long)p_Var8 + lVar14 + -8);
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_220,lVar3,
                             *(long *)((long)&p_Var8->_M_color + lVar14) + lVar3);
                  iVar9 = ::std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                                  *)local_278,&local_220);
                  if (iVar9._M_node != (_Base_ptr)(local_278 + 8)) {
                    value::pprint_value_abi_cxx11_
                              (&local_240,(value *)(*(long *)(iVar9._M_node + 2) + 0x298),
                               (Value *)(ulong)indent_00,1,(bool)in_R8B);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_240._M_dataplus._M_p != &local_240.field_2) {
                      operator_delete(local_240._M_dataplus._M_p,
                                      local_240.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != &local_220.field_2) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    local_220.field_2._M_allocated_capacity + 1);
                  }
                  uVar17 = uVar17 + 1;
                  p_Var8 = p_Var15[0x1e]._M_left;
                  lVar14 = lVar14 + 0x20;
                } while (uVar17 < (ulong)((long)p_Var15[0x1e]._M_right - (long)p_Var8 >> 5));
              }
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                          *)local_278,(_Link_type)local_268._M_allocated_capacity);
              uVar10 = extraout_EDX_01;
            }
            else {
              for (; uVar10 = (uint32_t)lVar14, p_Var16 != p_Var2;
                  p_Var16 = (_Base_ptr)&p_Var16[0x1a]._M_left) {
                value::pprint_value_abi_cxx11_
                          ((string *)local_278,(value *)&p_Var16[0x14]._M_right,
                           (Value *)(ulong)indent_00,1,(bool)in_R8B);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
                lVar14 = extraout_RDX_04;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._0_8_ != &local_268) {
                  operator_delete((void *)local_278._0_8_,
                                  (ulong)(local_268._M_allocated_capacity + 1));
                  lVar14 = extraout_RDX_05;
                }
              }
            }
            pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(ulong)local_244,uVar10);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_278._0_8_,
                                CONCAT44(uStack_26c,local_278._8_4_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._0_8_ != &local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
            }
            auVar18 = ::std::_Rb_tree_increment(p_Var15);
            uVar10 = auVar18._8_4_;
          } while ((_Base_ptr *)auVar18._0_8_ != local_1c0);
        }
        uVar17 = local_1d8;
        pprint::Indent_abi_cxx11_((string *)local_278,(pprint *)(local_1d8 & 0xffffffff),uVar10);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_278._0_8_,CONCAT44(uStack_26c,local_278._8_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
        p_Var15 = local_1c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ != &local_268) {
          operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_allocated_capacity + 1));
          p_Var15 = local_1c8;
        }
      }
      auVar19 = ::std::_Rb_tree_increment(p_Var15);
    } while ((_Rb_tree_header *)auVar19._0_8_ != local_1d0);
  }
  psVar4 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_variantSetStmt(
    const std::map<std::string, VariantSet> &vslist, const uint32_t indent) {
  std::stringstream ss;

  // ss << "# variantSet.size = " << std::to_string(vslist.size()) << "\n";
  for (const auto &variantSet : vslist) {
    if (variantSet.second.variantSet.empty()) {
      continue;
    }

    ss << pprint::Indent(indent) << "variantSet " << quote(variantSet.first)
       << " = {\n";

    for (const auto &item : variantSet.second.variantSet) {
      ss << pprint::Indent(indent + 1) << quote(item.first) << " ";

      if (item.second.metas().authored()) {
        ss << "(\n";
        ss << print_prim_metas(item.second.metas(), indent + 2);
        ss << pprint::Indent(indent + 1) << ") ";
      }

      ss << "{\n";

      // props
      ss << print_props(item.second.properties(), indent + 2);

      // primChildren
      // TODO: print child Prims based on `primChildren` Prim metadata
      const auto &variantPrimMetas = item.second.metas();
      const auto &variantPrimChildren = item.second.primChildren();

      if (variantPrimMetas.primChildren.size() == variantPrimChildren.size()) {
        std::map<std::string, const Prim *> primNameTable;
        for (size_t i = 0; i < variantPrimChildren.size(); i++) {
          primNameTable.emplace(variantPrimChildren[i].element_name(),
                                &variantPrimChildren[i]);
        }

        for (size_t i = 0; i < variantPrimMetas.primChildren.size(); i++) {
          value::token nameTok = variantPrimMetas.primChildren[i];
          DCOUT(fmt::format("variantPrimChildren  {}/{} = {}", i,
                            variantPrimMetas.primChildren.size(),
                            nameTok.str()));
          const auto it = primNameTable.find(nameTok.str());
          if (it != primNameTable.end()) {
            ss << pprint_value(it->second->data(), indent + 2,
                               /* closing_brace */ true);
          } else {
            // TODO: Report warning?
          }
        }
      } else {
        for (const auto &child : variantPrimChildren) {
          ss << pprint_value(child.data(), indent + 2,
                             /* closing_brace */ true);
        }
      }

      // ss << "# variantSet end\n";
      ss << pprint::Indent(indent + 1) << "}\n";
    }

    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}